

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O2

string * __thiscall
absl::(anonymous_namespace)::CEscapeInternal_abi_cxx11_
          (string *__return_storage_ptr__,void *this,string_view src,bool use_hex,bool utf8_safe)

{
  byte bVar1;
  char cVar2;
  void *pvVar3;
  bool bVar4;
  char local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pvVar3 = (void *)0x0;
  bVar4 = false;
  do {
    if (this == pvVar3) {
      return __return_storage_ptr__;
    }
    bVar1 = *(byte *)(src._M_len + (long)pvVar3);
    if (((((bVar1 == 9) || (bVar1 == 0x5c)) || (bVar1 == 0xd)) ||
        ((bVar1 == 0x22 || (bVar1 == 0x27)))) || (bVar1 == 10)) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_0024a2b6:
      bVar4 = false;
    }
    else {
      cVar2 = (char)__return_storage_ptr__;
      if ((use_hex && (char)bVar1 < '\0') ||
         (((byte)(bVar1 - 0x20) < 0x5f &&
          ((!bVar4 || (-1 < (char)(&ascii_internal::kPropertyBits)[bVar1])))))) {
LAB_0024a311:
        std::__cxx11::string::push_back(cVar2);
        goto LAB_0024a2b6;
      }
      local_38 = (char)src._M_str;
      if (local_38 == '\0') {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        std::__cxx11::string::push_back(cVar2);
        std::__cxx11::string::push_back(cVar2);
        goto LAB_0024a311;
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::push_back(cVar2);
      bVar4 = true;
      std::__cxx11::string::push_back(cVar2);
    }
    pvVar3 = (void *)((long)pvVar3 + 1);
  } while( true );
}

Assistant:

std::string CEscapeInternal(absl::string_view src, bool use_hex,
                            bool utf8_safe) {
  std::string dest;
  bool last_hex_escape = false;  // true if last output char was \xNN.

  for (char c : src) {
    bool is_hex_escape = false;
    switch (c) {
      case '\n': dest.append("\\" "n"); break;
      case '\r': dest.append("\\" "r"); break;
      case '\t': dest.append("\\" "t"); break;
      case '\"': dest.append("\\" "\""); break;
      case '\'': dest.append("\\" "'"); break;
      case '\\': dest.append("\\" "\\"); break;
      default: {
        // Note that if we emit \xNN and the src character after that is a hex
        // digit then that digit must be escaped too to prevent it being
        // interpreted as part of the character code by C.
        const unsigned char uc = static_cast<unsigned char>(c);
        if ((!utf8_safe || uc < 0x80) &&
            (!absl::ascii_isprint(uc) ||
             (last_hex_escape && absl::ascii_isxdigit(uc)))) {
          if (use_hex) {
            dest.append("\\" "x");
            dest.push_back(numbers_internal::kHexChar[uc / 16]);
            dest.push_back(numbers_internal::kHexChar[uc % 16]);
            is_hex_escape = true;
          } else {
            dest.append("\\");
            dest.push_back(numbers_internal::kHexChar[uc / 64]);
            dest.push_back(numbers_internal::kHexChar[(uc % 64) / 8]);
            dest.push_back(numbers_internal::kHexChar[uc % 8]);
          }
        } else {
          dest.push_back(c);
          break;
        }
      }
    }
    last_hex_escape = is_hex_escape;
  }

  return dest;
}